

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGeneratorFactory.cxx
# Opt level: O2

void __thiscall cmCPackGeneratorFactory::~cmCPackGeneratorFactory(cmCPackGeneratorFactory *this)

{
  (this->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCPackGeneratorFactory_005d3480;
  cmDeleteAll<std::vector<cmCPackGenerator*,std::allocator<cmCPackGenerator*>>>(&this->Generators);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->GeneratorDescriptions)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>_>_>
  ::~_Rb_tree(&(this->GeneratorCreators)._M_t);
  std::_Vector_base<cmCPackGenerator_*,_std::allocator<cmCPackGenerator_*>_>::~_Vector_base
            (&(this->Generators).
              super__Vector_base<cmCPackGenerator_*,_std::allocator<cmCPackGenerator_*>_>);
  return;
}

Assistant:

cmCPackGeneratorFactory::~cmCPackGeneratorFactory()
{
  cmDeleteAll(this->Generators);
}